

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O2

ostream * spvtools::utils::operator<<
                    (ostream *os,
                    HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                    *value)

{
  ushort uVar1;
  undefined4 uVar2;
  uint uVar3;
  ostream oVar4;
  short sVar5;
  uint uVar6;
  ostream *poVar7;
  ushort uVar8;
  short sVar9;
  long lVar10;
  char *pcVar11;
  
  uVar1 = (value->value_).data_;
  pcVar11 = "-";
  if (-1 < (short)uVar1) {
    pcVar11 = "";
  }
  uVar8 = uVar1 >> 10 & 0x1f;
  uVar6 = (uVar1 & 0x3ff) << 2;
  sVar5 = (short)uVar6;
  sVar9 = 0;
  if (uVar8 != 0 || sVar5 != 0) {
    sVar9 = uVar8 - 0xf;
  }
  if ((uVar8 != 0 || sVar5 != 0) && (uVar1 >> 10 & 0x1f) == 0) {
    while (uVar3 = uVar6 >> 0xb, uVar6 = uVar6 * 2, (uVar3 & 1) == 0) {
      sVar9 = sVar9 + -1;
    }
    uVar6 = uVar6 & 0xff8;
  }
  lVar10 = 3;
  while( true ) {
    if (((short)lVar10 == 0) || ((uVar6 & 0xf) != 0)) break;
    uVar6 = uVar6 >> 4;
    lVar10 = lVar10 + -1;
  }
  uVar2 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  oVar4 = (ostream)std::ios::fill();
  poVar7 = std::operator<<(os,pcVar11);
  poVar7 = std::operator<<(poVar7,"0x");
  std::operator<<(poVar7,'1' - (uVar8 == 0 && sVar5 == 0));
  if ((short)lVar10 != 0) {
    poVar7 = std::operator<<(os,".");
    *(long *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = lVar10;
    poVar7 = std::operator<<(poVar7,0x30);
    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::operator<<(poVar7,(ushort)uVar6);
  }
  poVar7 = std::operator<<(os,"p");
  *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
       *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
  pcVar11 = "";
  if (-1 < sVar9) {
    pcVar11 = "+";
  }
  poVar7 = std::operator<<(poVar7,pcVar11);
  std::ostream::operator<<(poVar7,sVar9);
  lVar10 = *(long *)os;
  *(undefined4 *)(os + *(long *)(lVar10 + -0x18) + 0x18) = uVar2;
  lVar10 = *(long *)(lVar10 + -0x18);
  std::ios::fill();
  os[lVar10 + 0xe0] = oVar4;
  return os;
}

Assistant:

T value() const { return value_; }